

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

void recall_tree_ns::init_tree(recall_tree *b,uint32_t root,uint32_t depth,uint32_t *routers_used)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t root_00;
  ulong uVar3;
  node local_88;
  
  if ((ulong)depth <= b->max_depth) {
    uVar2 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * 0x2e8ba2e8ba2e8ba3;
    local_88.internal = false;
    local_88.parent = 0;
    local_88.recall_lbest = 0.0;
    local_88.depth = 0;
    local_88.base_router = 0;
    local_88.left = 0;
    local_88.right = 0;
    local_88.n = 0.0;
    local_88.entropy = 0.0;
    local_88.passes = 1.0;
    local_88.preds._begin = (node_pred *)0x0;
    local_88.preds._end = (node_pred *)0x0;
    local_88.preds.end_array = (node_pred *)0x0;
    local_88.preds.erase_count = 0;
    v_array<recall_tree_ns::node>::push_back(&b->nodes,&local_88);
    uVar3 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * 0x2e8ba2e8ba2e8ba3;
    local_88.internal = false;
    local_88.parent = 0;
    local_88.recall_lbest = 0.0;
    local_88.depth = 0;
    local_88.base_router = 0;
    local_88.left = 0;
    local_88.right = 0;
    local_88.n = 0.0;
    local_88.entropy = 0.0;
    local_88.passes = 1.0;
    local_88.preds._begin = (node_pred *)0x0;
    local_88.preds._end = (node_pred *)0x0;
    local_88.preds.end_array = (node_pred *)0x0;
    local_88.preds.erase_count = 0;
    v_array<recall_tree_ns::node>::push_back(&b->nodes,&local_88);
    uVar1 = *routers_used;
    *routers_used = uVar1 + 1;
    (b->nodes)._begin[root].base_router = uVar1;
    (b->nodes)._begin[root].internal = true;
    uVar1 = (uint32_t)uVar2;
    (b->nodes)._begin[root].left = uVar1;
    uVar2 = uVar2 & 0xffffffff;
    (b->nodes)._begin[uVar2].parent = root;
    (b->nodes)._begin[uVar2].depth = depth;
    root_00 = (uint32_t)uVar3;
    (b->nodes)._begin[root].right = root_00;
    uVar3 = uVar3 & 0xffffffff;
    (b->nodes)._begin[uVar3].parent = root;
    (b->nodes)._begin[uVar3].depth = depth;
    init_tree(b,uVar1,depth + 1,routers_used);
    init_tree(b,root_00,depth + 1,routers_used);
  }
  return;
}

Assistant:

void init_tree(recall_tree& b, uint32_t root, uint32_t depth, uint32_t& routers_used)
{
  if (depth <= b.max_depth)
  {
    uint32_t left_child;
    uint32_t right_child;
    left_child = (uint32_t)b.nodes.size();
    b.nodes.push_back(node());
    right_child = (uint32_t)b.nodes.size();
    b.nodes.push_back(node());
    b.nodes[root].base_router = routers_used++;

    b.nodes[root].internal = true;
    b.nodes[root].left = left_child;
    b.nodes[left_child].parent = root;
    b.nodes[left_child].depth = depth;
    b.nodes[root].right = right_child;
    b.nodes[right_child].parent = root;
    b.nodes[right_child].depth = depth;

    init_tree(b, left_child, depth + 1, routers_used);
    init_tree(b, right_child, depth + 1, routers_used);
  }
}